

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall Json::Value::demand(Value *this,char *begin,char *end)

{
  Value *pVVar1;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  if ((*(char *)&this->bits_ != '\0') && (*(char *)&this->bits_ != '\a')) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,
               "in Json::Value::demand(begin, end): requires objectValue or nullValue",0x45);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  }
  pVVar1 = resolveReference(this,begin,end);
  return pVVar1;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}